

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_diff_equivnode(lyd_node *first,lyd_node *second)

{
  lys_node *plVar1;
  int iVar2;
  lys_node *plVar3;
  
  if (second != (lyd_node *)0x0 && first != (lyd_node *)0x0) {
    do {
      plVar3 = first->schema;
      plVar1 = second->schema;
      if (plVar3->module->ctx == plVar1->module->ctx) {
        if (plVar3 != plVar1) {
          return 0;
        }
      }
      else {
        iVar2 = ly_strequal_(plVar3->name,plVar1->name);
        if (iVar2 == 0) {
          return 0;
        }
        plVar3 = first->schema;
      }
      if ((plVar3->nodetype == LYS_LIST) && (iVar2 = lyd_list_equal(first,second,0), iVar2 != 1)) {
        return 0;
      }
      first = first->parent;
      second = second->parent;
    } while ((first != (lyd_node *)0x0) && (second != (lyd_node *)0x0));
  }
  return (uint)(first == second);
}

Assistant:

static int
lyd_diff_equivnode(struct lyd_node *first, struct lyd_node *second)
{
    struct lyd_node *iter1, *iter2;

    for (iter1 = first, iter2 = second; iter1 && iter2; iter1 = iter1->parent, iter2 = iter2->parent) {
        if (iter1->schema->module->ctx == iter2->schema->module->ctx) {
            if (iter1->schema != iter2->schema) {
                return 0;
            }
        } else {
            if (!ly_strequal(iter1->schema->name, iter2->schema->name, 0)) {
                /* comparing the names is fine, even if they are, in fact, 2 different nodes
                 * with equal names, some of their parents will differ */
                return 0;
            }
        }
        if (iter1->schema->nodetype == LYS_LIST) {
            /* compare keys */
            if (lyd_list_equal(iter1, iter2, 0) != 1) {
                return 0;
            }
        }
    }

    if (iter1 != iter2) {
        /* we are supposed to be in root (NULL) in both trees */
        return 0;
    }

    return 1;
}